

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O0

QByteArray * __thiscall
QDtlsPrivateOpenSSL::decryptDatagram
          (QDtlsPrivateOpenSSL *this,QUdpSocket *socket,QByteArray *tlsdgram)

{
  int iVar1;
  uint uVar2;
  unsigned_long uVar3;
  long lVar4;
  QByteArray *in_RCX;
  Data *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int shutdown;
  unsigned_long errorCode;
  int read;
  QByteArray *dgram;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  DtlsState *in_stack_ffffffffffffff10;
  char16_t **ppcVar5;
  SSL *in_stack_ffffffffffffff18;
  QString *a;
  QChar fillChar;
  QChar local_6a [25];
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = in_RDI;
  QByteArray::operator=((QByteArray *)(in_RSI + 9),(QByteArray *)in_RCX);
  in_RSI[0xc].d.d = in_RDX;
  (**(code **)((in_RSI->d).ptr + 0x14))(&(in_RSI->d).ptr);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QByteArray::QByteArray((QByteArray *)0x17f1ad);
  QByteArray::size(in_RCX);
  QByteArray::resize((longlong)in_RDI);
  QSharedPointer<ssl_st>::data((QSharedPointer<ssl_st> *)0x17f1d9);
  QByteArray::data((QByteArray *)in_stack_ffffffffffffff10);
  QByteArray::size((QByteArray *)in_RDI);
  iVar1 = q_SSL_read(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (iVar1 < 1) {
    QByteArray::clear();
    uVar3 = q_ERR_get_error();
    if (uVar3 == 0) {
      QSharedPointer<ssl_st>::data((QSharedPointer<ssl_st> *)0x17f265);
      uVar2 = q_SSL_get_shutdown((SSL *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ));
      if ((uVar2 & 2) == 0) goto LAB_0017f437;
      uVar3 = 6;
    }
    lVar4 = uVar3 - 1;
    switch(lVar4) {
    case 0:
    case 4:
    default:
      ppcVar5 = &(in_RSI->d).ptr;
      QDtls::tr((char *)in_stack_ffffffffffffff18,(char *)ppcVar5,in_stack_ffffffffffffff0c);
      fillChar.ucs = (char16_t)(uVar3 >> 0x30);
      iVar1 = (int)((ulong)lVar4 >> 0x20);
      QTlsBackendOpenSSL::getErrorsFromOpenSsl();
      QChar::QChar<char16_t,_true>(local_6a,L' ');
      QString::arg<QString,_true>(in_RSI,a,iVar1,fillChar);
      (**(code **)((in_RSI->d).ptr + 8))(ppcVar5,8,local_38);
      QString::~QString((QString *)0x17f410);
      QString::~QString((QString *)0x17f41d);
      QString::~QString((QString *)0x17f42a);
      break;
    case 1:
    case 2:
      break;
    case 5:
      *(undefined1 *)&in_RSI[0x11].d.size = 1;
      ppcVar5 = &(in_RSI->d).ptr;
      QDtls::tr((char *)ppcVar5,(char *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      (**(code **)((in_RSI->d).ptr + 8))(ppcVar5,4,local_20);
      QString::~QString((QString *)0x17f338);
      dtlsopenssl::DtlsState::reset(in_stack_ffffffffffffff10);
      *(undefined1 *)&in_RSI[0x11].d.d = 0;
      *(undefined4 *)&in_RSI[0xe].d.size = 0;
    }
  }
  else {
    QByteArray::resize((longlong)in_RDI);
  }
LAB_0017f437:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)a;
}

Assistant:

QByteArray QDtlsPrivateOpenSSL::decryptDatagram(QUdpSocket *socket, const QByteArray &tlsdgram)
{
    Q_ASSERT(socket);
    Q_ASSERT(tlsdgram.size());

    Q_ASSERT(dtls.tlsConnection.data());
    Q_ASSERT(connectionEncrypted);

    dtls.dgram = tlsdgram;
    dtls.udpSocket = socket;

    clearDtlsError();

    QByteArray dgram;
    dgram.resize(tlsdgram.size());
    const int read = q_SSL_read(dtls.tlsConnection.data(), dgram.data(),
                                dgram.size());

    if (read > 0) {
        dgram.resize(read);
        return dgram;
    }

    dgram.clear();
    unsigned long errorCode = q_ERR_get_error();
    if (errorCode == SSL_ERROR_NONE) {
        const int shutdown = q_SSL_get_shutdown(dtls.tlsConnection.data());
        if (shutdown & SSL_RECEIVED_SHUTDOWN)
            errorCode = SSL_ERROR_ZERO_RETURN;
        else
            return dgram;
    }

    switch (errorCode) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
        return dgram;
    case SSL_ERROR_ZERO_RETURN:
        // "The connection was shut down cleanly" ... hmm, whatever,
        // needs testing (DTLSTODO).
        connectionWasShutdown = true;
        setDtlsError(QDtlsError::RemoteClosedConnectionError,
                     QDtls::tr("The DTLS connection has been shutdown"));
        dtls.reset();
        connectionEncrypted = false;
        handshakeState = QDtls::HandshakeNotStarted;
        return dgram;
    case SSL_ERROR_SYSCALL: // some IO error
    case SSL_ERROR_SSL:     // error in the SSL library
        // DTLSTODO: Apparently, some errors can be ignored, for example,
        // ECONNRESET etc. This all needs a lot of testing!!!
    default:
        setDtlsError(QDtlsError::TlsNonFatalError,
                     QDtls::tr("Error while reading: %1")
                               .arg(QTlsBackendOpenSSL::getErrorsFromOpenSsl()));
        return dgram;
    }
}